

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::DatabaseInterface::promote_sub_database_to_whitelist(DatabaseInterface *this,uint index)

{
  uint local_14;
  DatabaseInterface *pDStack_10;
  uint index_local;
  DatabaseInterface *this_local;
  
  if (this->impl->mode == ReadOnly) {
    local_14 = index;
    pDStack_10 = this;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->impl->sub_databases_in_whitelist,&local_14);
  }
  return;
}

Assistant:

void DatabaseInterface::promote_sub_database_to_whitelist(unsigned index)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return;

	impl->sub_databases_in_whitelist.push_back(index);
}